

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall efsw::DirectorySnapshot::setDirectoryInfo(DirectorySnapshot *this,string *directory)

{
  FileInfo FStack_58;
  
  FileInfo::FileInfo(&FStack_58,directory);
  FileInfo::operator=(&this->DirectoryInfo,&FStack_58);
  std::__cxx11::string::~string((string *)&FStack_58);
  return;
}

Assistant:

void DirectorySnapshot::setDirectoryInfo( std::string directory ) {
	DirectoryInfo = FileInfo( directory );
}